

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMMLexer.cpp
# Opt level: O0

Token __thiscall cmm::CMMLexer::LexString(CMMLexer *this)

{
  LocTy ErrorLoc;
  char cVar1;
  bool bVar2;
  int iVar3;
  int_type iVar4;
  allocator local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  allocator local_81;
  string local_80;
  LocTy local_60;
  LocTy Loc;
  allocator local_41;
  string local_40;
  int local_1c;
  CMMLexer *pCStack_18;
  int CurChar;
  CMMLexer *this_local;
  
  pCStack_18 = this;
  std::__cxx11::string::clear();
  while( true ) {
    iVar3 = getNextChar(this);
    local_1c = iVar3;
    if (iVar3 == 0x22) {
      Token::Token((Token *)((long)&this_local + 4),String);
      return (Token)this_local._4_4_;
    }
    iVar4 = std::char_traits<char>::eof();
    if (iVar3 == iVar4) break;
    if (local_1c == 0x5c) {
      local_60 = SourceMgr::getLoc(this->SrcMgr);
      iVar3 = getNextChar(this);
      local_1c = iVar3;
      iVar4 = std::char_traits<char>::eof();
      if (iVar3 == iVar4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_80,"end of file in string constant after \\",&local_81);
        Error(this,&local_80);
        std::__cxx11::string::~string((string *)&local_80);
        std::allocator<char>::~allocator((allocator<char> *)&local_81);
        Token::Token((Token *)((long)&this_local + 4),Error);
        return (Token)this_local._4_4_;
      }
      bVar2 = UnEscapeChar(&local_1c);
      ErrorLoc = local_60;
      if (bVar2) {
        cVar1 = (char)local_1c;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_e8,1,cVar1,&local_e9);
        std::operator+(&local_c8,"\\",&local_e8);
        std::operator+(&local_a8,&local_c8," is an invalid escaping sequence in string literal");
        Warning(this,ErrorLoc,&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_e9);
        std::__cxx11::string::push_back((char)this + '\x18');
      }
    }
    std::__cxx11::string::push_back((char)this + '\x18');
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"end of file in string constant",&local_41);
  Error(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  Token::Token((Token *)((long)&this_local + 4),Error);
  return (Token)this_local._4_4_;
}

Assistant:

Token CMMLexer::LexString() {
  StrVal.clear();
  for (;;) {
    int CurChar = getNextChar();

    if (CurChar == '"') {
      // UnEscapeLexed(StrVal);
      return Token::String;
    }

    if (CurChar == std::char_traits<char>::eof()) {
      Error("end of file in string constant");
      return Token::Error;
    }

    if (CurChar == '\\') {
      LocTy Loc = SrcMgr.getLoc();

      CurChar = getNextChar();

      if (CurChar == std::char_traits<char>::eof()) {
        Error("end of file in string constant after \\");
        return Token::Error;
      }

      if (UnEscapeChar(CurChar)) {
        Warning(Loc, "\\" + std::string(1, static_cast<char>(CurChar)) +
            " is an invalid escaping sequence in string literal");
        StrVal.push_back('\\');
      }
    }
    StrVal.push_back(static_cast<char>(CurChar));
  }
}